

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O1

void move_deviceOrModule_members_to_module
               (IOTHUB_DEVICE_OR_MODULE *deviceOrModule,IOTHUB_MODULE *module)

{
  if ((deviceOrModule != (IOTHUB_DEVICE_OR_MODULE *)0x0) && (0 < module->version)) {
    module->deviceId = deviceOrModule->deviceId;
    module->primaryKey = deviceOrModule->primaryKey;
    module->secondaryKey = deviceOrModule->secondaryKey;
    module->generationId = deviceOrModule->generationId;
    module->eTag = deviceOrModule->eTag;
    module->connectionState = deviceOrModule->connectionState;
    module->connectionStateUpdatedTime = deviceOrModule->connectionStateUpdatedTime;
    module->status = deviceOrModule->status;
    module->statusReason = deviceOrModule->statusReason;
    module->statusUpdatedTime = deviceOrModule->statusUpdatedTime;
    module->lastActivityTime = deviceOrModule->lastActivityTime;
    module->cloudToDeviceMessageCount = deviceOrModule->cloudToDeviceMessageCount;
    module->isManaged = deviceOrModule->isManaged;
    module->configuration = deviceOrModule->configuration;
    module->deviceProperties = deviceOrModule->deviceProperties;
    module->serviceProperties = deviceOrModule->serviceProperties;
    module->authMethod = deviceOrModule->authMethod;
    module->moduleId = deviceOrModule->moduleId;
    module->managedBy = deviceOrModule->managedBy;
  }
  return;
}

Assistant:

static void move_deviceOrModule_members_to_module(IOTHUB_DEVICE_OR_MODULE* deviceOrModule, IOTHUB_MODULE* module)
{
    if ((deviceOrModule != NULL) && (module != NULL))
    {
        if (module->version >= IOTHUB_MODULE_VERSION_1)
        {
            module->deviceId = deviceOrModule->deviceId;
            module->primaryKey = deviceOrModule->primaryKey;
            module->secondaryKey = deviceOrModule->secondaryKey;
            module->generationId = deviceOrModule->generationId;
            module->eTag = deviceOrModule->eTag;
            module->connectionState = deviceOrModule->connectionState;
            module->connectionStateUpdatedTime = deviceOrModule->connectionStateUpdatedTime;
            module->status = deviceOrModule->status;
            module->statusReason = deviceOrModule->statusReason;
            module->statusUpdatedTime = deviceOrModule->statusUpdatedTime;
            module->lastActivityTime = deviceOrModule->lastActivityTime;
            module->cloudToDeviceMessageCount = deviceOrModule->cloudToDeviceMessageCount;
            module->isManaged = deviceOrModule->isManaged;
            module->configuration = deviceOrModule->configuration;
            module->deviceProperties = deviceOrModule->deviceProperties;
            module->serviceProperties = deviceOrModule->serviceProperties;
            module->authMethod = deviceOrModule->authMethod;
            module->moduleId = deviceOrModule->moduleId;
            module->managedBy = deviceOrModule->managedBy;
        }
    }
}